

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void __thiscall
QInputMethodEvent::QInputMethodEvent
          (QInputMethodEvent *this,QString *preeditText,
          QList<QInputMethodEvent::Attribute> *attributes)

{
  QEvent *in_RDI;
  QList<QInputMethodEvent::Attribute> *in_stack_ffffffffffffffd8;
  
  QEvent::QEvent(in_RDI,InputMethod);
  *(undefined ***)in_RDI = &PTR__QInputMethodEvent_00e15a88;
  QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffffd8);
  QString::QString((QString *)0x34d6ca);
  QList<QInputMethodEvent::Attribute>::QList
            ((QList<QInputMethodEvent::Attribute> *)in_RDI,in_stack_ffffffffffffffd8);
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  return;
}

Assistant:

QInputMethodEvent::QInputMethodEvent(const QString &preeditText, const QList<Attribute> &attributes)
    : QEvent(QEvent::InputMethod), m_preedit(preeditText), m_attributes(attributes),
      m_replacementStart(0), m_replacementLength(0)
{
}